

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

char * google::glog_internal_namespace_::const_basename(char *filepath)

{
  char *pcVar1;
  char *in_RDI;
  char *base;
  char *local_18;
  
  pcVar1 = strrchr(in_RDI,0x2f);
  local_18 = in_RDI;
  if (pcVar1 != (char *)0x0) {
    local_18 = pcVar1 + 1;
  }
  return local_18;
}

Assistant:

const char* const_basename(const char* filepath) {
  const char* base = strrchr(filepath, '/');
#ifdef OS_WINDOWS  // Look for either path separator in Windows
  if (!base)
    base = strrchr(filepath, '\\');
#endif
  return base ? (base+1) : filepath;
}